

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O1

AssertionResult * __thiscall
iutest::detail::ElementsAreMatcherBase::
Check<0,1,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::tuple<iutest::detail::GeMatcher<int>,iutest::detail::GtMatcher<int>>>
          (AssertionResult *__return_storage_ptr__,ElementsAreMatcherBase *this,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> it,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> end,
          tuple<iutest::detail::GeMatcher<int>,_iutest::detail::GtMatcher<int>_> *matchers)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  AssertionResult *pAVar3;
  type **in_R9;
  size_t cnt;
  ulong local_50;
  int local_44;
  AssertionResult local_40;
  
  local_50 = (long)it._M_current - (long)this >> 2;
  if (local_50 < 2) {
    paVar1 = &local_40.m_message.field_2;
    local_40.m_message._M_string_length = 0;
    local_40.m_message.field_2._M_local_buf[0] = '\0';
    local_40.m_result = false;
    local_40.m_message._M_dataplus._M_p = (pointer)paVar1;
    pAVar3 = AssertionResult::operator<<(&local_40,(char (*) [23])"ElementsAre: argument[");
    pAVar3 = AssertionResult::operator<<(pAVar3,&local_50);
    pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [16])"] is less than ");
    local_44 = 2;
    pAVar3 = AssertionResult::operator<<(pAVar3,&local_44);
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    pcVar2 = (pAVar3->m_message)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (pAVar3->m_message)._M_string_length
              );
    __return_storage_ptr__->m_result = pAVar3->m_result;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_40.m_message._M_dataplus._M_p,
                      CONCAT71(local_40.m_message.field_2._M_allocated_capacity._1_7_,
                               local_40.m_message.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    CheckElem<0,1,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::tuple<iutest::detail::GeMatcher<int>,iutest::detail::GtMatcher<int>>>
              (__return_storage_ptr__,this,it,end,
               (tuple<iutest::detail::GeMatcher<int>,_iutest::detail::GtMatcher<int>_> *)
               &iutest_type_traits::enabler_t<void>::value,in_R9);
  }
  return __return_storage_ptr__;
}

Assistant:

static AssertionResult Check(Ite it, Ite end, M& matchers)
    {
        const size_t cnt = ::std::distance(it, end);
        if IUTEST_COND_UNLIKELY( cnt < LAST+1 )
        {
            return AssertionFailure() << "ElementsAre: argument[" << cnt << "] is less than " << LAST+1;
        }